

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O3

void __thiscall
gvr::MultiTexturedMesh::savePLY(MultiTexturedMesh *this,char *plyname,bool all,ply_encoding enc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  pointer pbVar3;
  size_t __n;
  undefined7 in_register_00000011;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_01;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_02;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *pvVar4;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  char cVar5;
  long lVar6;
  int iVar7;
  string *name;
  long lVar8;
  ulong uVar9;
  long lVar10;
  PLYWriter ply;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined4 local_27c;
  PLYWriter local_278;
  
  local_27c = (undefined4)CONCAT71(in_register_00000011,all);
  PLYWriter::PLYWriter(&local_278);
  PLYWriter::open(&local_278,plyname,enc);
  Model::setOriginToPLY((Model *)this,&local_278);
  pbVar3 = (this->name).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->name).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      std::operator+(&local_2a0,"TextureFile ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar3->_M_dataplus)._M_p + (lVar6 >> 0x1b)));
      PLYWriter::addComment(&local_278,&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      uVar9 = uVar9 + 1;
      pbVar3 = (this->name).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x100000000;
    } while (uVar9 < (ulong)((long)(this->name).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5));
  }
  paVar1 = &local_2a0.field_2;
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
  PLYWriter::addElement(&local_278,&local_2a0,(long)(this->super_Mesh).super_PointCloud.n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"x","");
  uVar2 = local_27c;
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"y","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"z","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  cVar5 = (char)uVar2;
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (cVar5 == '\0') goto LAB_00131ecd;
  }
  else {
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"scan_size","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if (cVar5 == '\0') goto LAB_00131ecd;
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"scan_error","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"scan_conf","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"sx","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"sy","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"sz","");
    PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"nx","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"ny","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"nz","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
LAB_00131ecd:
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"face","");
  PLYWriter::addElement(&local_278,&local_2a0,(long)(this->super_Mesh).n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex_indices","");
  PLYWriter::addProperty(&local_278,&local_2a0,ply_uint8,ply_uint32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"texcoord","");
  __n = 7;
  PLYWriter::addProperty(&local_278,&local_2a0,ply_uint8,ply_float32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"texnumber","");
  name = &local_2a0;
  PLYWriter::addProperty(&local_278,name,ply_int32);
  pvVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p);
    pvVar4 = extraout_RDX_00;
  }
  iVar7 = (int)name;
  if (0 < (this->super_Mesh).super_PointCloud.n) {
    lVar6 = 0;
    do {
      PLYWriter::write(&local_278,(int)name,pvVar4,__n);
      PLYWriter::write(&local_278,(int)name,__buf,__n);
      PLYWriter::write(&local_278,(int)name,__buf_00,__n);
      if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
        pvVar4 = __buf_01;
        if (cVar5 != '\0') goto LAB_00132084;
      }
      else {
        PLYWriter::write(&local_278,(int)name,__buf_01,__n);
        pvVar4 = __buf_02;
        if (cVar5 != '\0') {
          PLYWriter::write(&local_278,(int)name,__buf_02,__n);
          PLYWriter::write(&local_278,(int)name,__buf_03,__n);
          pvVar4 = extraout_RDX_01;
LAB_00132084:
          if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
            PLYWriter::write(&local_278,(int)name,pvVar4,__n);
            PLYWriter::write(&local_278,(int)name,__buf_04,__n);
            PLYWriter::write(&local_278,(int)name,__buf_05,__n);
            pvVar4 = extraout_RDX_02;
          }
          PLYWriter::write(&local_278,(int)name,pvVar4,__n);
          PLYWriter::write(&local_278,(int)name,__buf_06,__n);
          PLYWriter::write(&local_278,(int)name,__buf_07,__n);
          pvVar4 = extraout_RDX_03;
        }
      }
      iVar7 = (int)name;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->super_Mesh).super_PointCloud.n);
  }
  if (0 < (this->super_Mesh).n) {
    lVar10 = 0;
    lVar6 = 0;
    lVar8 = 0;
    do {
      PLYWriter::writeListSize(&local_278,3);
      PLYWriter::write(&local_278,*(int *)((long)(this->super_Mesh).triangle + lVar6),__buf_08,__n);
      PLYWriter::write(&local_278,*(int *)((long)(this->super_Mesh).triangle + lVar6 + 4),__buf_09,
                       __n);
      PLYWriter::write(&local_278,*(int *)((long)(this->super_Mesh).triangle + lVar6 + 8),__buf_10,
                       __n);
      iVar7 = 6;
      PLYWriter::writeListSize(&local_278,6);
      PLYWriter::write(&local_278,iVar7,__buf_11,__n);
      PLYWriter::write(&local_278,iVar7,__buf_12,__n);
      PLYWriter::write(&local_278,iVar7,__buf_13,__n);
      PLYWriter::write(&local_278,iVar7,__buf_14,__n);
      PLYWriter::write(&local_278,iVar7,__buf_15,__n);
      PLYWriter::write(&local_278,iVar7,__buf_16,__n);
      iVar7 = *(int *)((long)this->uvt->uv + lVar10 + 0x18);
      PLYWriter::write(&local_278,iVar7,__buf_17,__n);
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0xc;
      lVar10 = lVar10 + 0x1c;
    } while (lVar8 < (this->super_Mesh).n);
  }
  PLYWriter::close(&local_278,iVar7);
  PLYWriter::~PLYWriter(&local_278);
  return;
}

Assistant:

void MultiTexturedMesh::savePLY(const char *plyname, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(plyname, enc);

  // define header

  setOriginToPLY(ply);

  for (size_t i=0; i<name.size(); i++)
  {
    ply.addComment("TextureFile "+getTextureName(static_cast<int>(i)));
  }

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);
  ply.addProperty("texcoord", ply_uint8, ply_float32);
  ply.addProperty("texnumber", ply_int32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));

    ply.writeListSize(6);
    ply.write(getTextureCoordComp(i, 0, 0));
    ply.write(getTextureCoordComp(i, 0, 1));
    ply.write(getTextureCoordComp(i, 1, 0));
    ply.write(getTextureCoordComp(i, 1, 1));
    ply.write(getTextureCoordComp(i, 2, 0));
    ply.write(getTextureCoordComp(i, 2, 1));

    ply.write(getTextureIndex(i));
  }

  ply.close();
}